

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O3

bool __thiscall WellFounded::propRule(WellFounded *this,ConjRule *r)

{
  uint uVar1;
  bool bVar2;
  bool *pbVar3;
  ulong uVar4;
  int x;
  uint local_24;
  ConjRule *local_20;
  
  if ((long)r->w < 0) {
    pbVar3 = (this->no_support_bool).data;
  }
  else {
    pbVar3 = (this->no_support_bool).data;
    uVar4 = (long)r->w;
    do {
      if (pbVar3[(uint)r->body[uVar4]] != false) {
        uVar1 = r->body[uVar4 & 0xffffffff];
        local_24 = uVar1;
        local_20 = r;
        vec<ConjRule_*>::push((this->watches).data + uVar1,&local_20);
        if ((this->ufset_bool).data[uVar1] == false) {
          vec<int>::push(&this->ufset,(int *)&local_24);
          (this->ufset_bool).data[local_24] = true;
        }
        return false;
      }
      r->w = (int)(uVar4 - 1);
      bVar2 = 0 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
  }
  pbVar3[(uint)r->head] = false;
  vec<int>::push(&this->nfset,&r->head);
  (this->support).data[(uint)r->head] = r;
  return true;
}

Assistant:

bool propRule(ConjRule& r) {
		for (; r.w >= 0; r.w--) {
			if (no_support_bool[r.body[r.w]]) {
				break;
			}
		}
		if (r.w < 0) {
			if (DEBUG) {
				printf("found support for %d\n", r.head);
			}
			// all literals are founded, make h founded.
			no_support_bool[r.head] = false;
			nfset.push(r.head);
			support[r.head] = &r;
			return true;
		}
		const int x = r.body[r.w];
		watches[x].push(&r);
		if (!ufset_bool[x]) {
			if (DEBUG) {
				printf("%d added to ufset\n", x);
			}
			ufset.push(x);
			ufset_bool[x] = true;
		}
		return false;
	}